

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O1

bool __thiscall Clasp::DefaultMinimize::integrateBound(DefaultMinimize *this,Solver *s)

{
  undefined1 *puVar1;
  size_type sVar2;
  size_type sVar3;
  uint uVar4;
  SharedData *pSVar5;
  SharedMinimizeData *this_00;
  wsum_t *pwVar6;
  long lVar7;
  bool bVar8;
  uint32 uVar9;
  uint32 uVar10;
  ulong uVar11;
  int iVar12;
  bool bVar13;
  uint32 x;
  WeightLiteral min;
  uint32 local_3c;
  WeightLiteral local_38;
  
  pSVar5 = (this->super_MinimizeConstraint).shared_;
  if (pSVar5->optGen_ == 0) {
    bVar13 = pSVar5->mode_ == enumerate;
LAB_00151c8d:
    if (!bVar13) {
      bVar13 = true;
      if (*(uint *)&(this->step_).field_0x4 < 0x40000000) {
        bVar13 = ((this->super_MinimizeConstraint).shared_)->mode_ == enumOpt;
      }
      goto LAB_00151cb1;
    }
  }
  else if (pSVar5->mode_ != enumerate) {
    bVar13 = (pSVar5->gCount_).super___atomic_base<unsigned_int>._M_i == pSVar5->optGen_;
    goto LAB_00151c8d;
  }
  bVar13 = false;
LAB_00151cb1:
  bVar8 = MinimizeConstraint::prepare(&this->super_MinimizeConstraint,s,bVar13);
  if (bVar8) {
    if ((bVar13 != false) &&
       (*(uint *)((long)(s->assign_).assign_.ebo_.buf +
                 (ulong)((this->super_MinimizeConstraint).tag_.rep_ & 0xfffffffc)) < 0x10)) {
      puVar1 = &(this->step_).field_0x7;
      *puVar1 = *puVar1 & 0x3f;
      stepInit(this,0);
    }
    if ((*this->bounds_ == 0x7fffffffffffffff) ||
       ((pSVar5 = (this->super_MinimizeConstraint).shared_, pSVar5->mode_ != enumerate &&
        ((pSVar5->gCount_).super___atomic_base<unsigned_int>._M_i != pSVar5->optGen_)))) {
      sVar2 = (((this->super_MinimizeConstraint).shared_)->weights).ebo_.size;
      local_38.second = sVar2 - 1;
      if (sVar2 == 0) {
        local_38.second = 0;
      }
      local_38.first.rep_ = 0;
      do {
        if ((s->conflict_).ebo_.size != 0) goto LAB_00151e92;
        pSVar5 = (this->super_MinimizeConstraint).shared_;
        if (pSVar5->mode_ == enumerate) {
          bVar13 = false;
        }
        else {
          bVar13 = (pSVar5->gCount_).super___atomic_base<unsigned_int>._M_i != pSVar5->optGen_;
        }
        bVar13 = updateBounds(this,bVar13);
        if (!bVar13) goto LAB_00151e92;
        local_3c = 0;
        sVar3 = (s->levels_).super_type.ebo_.size;
        this_00 = (this->super_MinimizeConstraint).shared_;
        pwVar6 = this->bounds_;
        if ((this_00->weights).ebo_.size == 0) {
          bVar13 = *pwVar6 < (long)local_38.second + pwVar6[this->size_];
        }
        else {
          bVar13 = SharedMinimizeData::imp
                             (this_00,pwVar6 + this->size_,
                              (this_00->weights).ebo_.buf + (uint)local_38.second,pwVar6,
                              &this->actLev_);
        }
        if (bVar13 == false) {
          uVar9 = sVar3 + 1;
LAB_00151e03:
          do {
            while( true ) {
              if (((s->conflict_).ebo_.size != 0) && (bVar13 = Solver::resolveConflict(s), !bVar13))
              goto LAB_00151dc8;
              uVar10 = Solver::undoUntil(s,uVar9 - 1,1);
              if (uVar10 <= uVar9 - 1) break;
              Solver::backtrack(s);
            }
            iVar12 = 1;
            bVar13 = propagateImpl(this,s,propagate_new_opt);
          } while (!bVar13);
        }
        else {
          uVar9 = computeImplicationSet(this,s,&local_38,&local_3c);
          if ((s->levels_).root < uVar9) goto LAB_00151e03;
LAB_00151dc8:
          pSVar5 = (this->super_MinimizeConstraint).shared_;
          iVar12 = 3;
          if ((pSVar5->mode_ != enumerate) &&
             ((pSVar5->gCount_).super___atomic_base<unsigned_int>._M_i != pSVar5->optGen_)) {
            uVar4 = *(uint *)&(this->step_).field_0x4;
            if ((ulong)uVar4 < 0x40000000) {
              *(uint *)&(this->step_).field_0x4 = uVar4 + 1 & 0x3fffffff;
            }
            else {
              pwVar6 = this->bounds_;
              uVar11 = (ulong)uVar4 & 0x3fffffff;
              lVar7 = pwVar6[uVar11];
              pwVar6[uVar11] = lVar7 + 1;
              pwVar6[(ulong)(this->size_ * 3) +
                     ((ulong)*(uint *)&(this->step_).field_0x4 & 0x3fffffff)] = lVar7 + 1;
            }
            iVar12 = 0;
          }
        }
      } while (iVar12 == 0);
      if (iVar12 == 3) {
LAB_00151e92:
        bVar13 = false;
        relaxBound(this,false);
        if ((s->conflict_).ebo_.size == 0) {
          bVar13 = false;
          Solver::undoUntilImpl(s,0,false);
          Solver::setStopConflict(s);
        }
      }
      else {
        bVar13 = true;
      }
    }
    else {
      bVar13 = (s->conflict_).ebo_.size == 0;
    }
  }
  else {
    bVar13 = false;
  }
  return bVar13;
}

Assistant:

bool DefaultMinimize::integrateBound(Solver& s) {
	bool useTag = shared_->optimize() && (step_.type != 0 || shared_->mode() == MinimizeMode_t::enumOpt);
	if (!prepare(s, useTag)) { return false; }
	if (useTag && s.level(tag_.var()) == 0) {
		step_.type = 0;
		stepInit(0);
	}
	if ((active() && !shared_->checkNext())) { return !s.hasConflict(); }
	WeightLiteral min(lit_true(), shared_->weights.empty() ? uint32(0) : (uint32)shared_->weights.size()-1);
	while (!s.hasConflict() && updateBounds(shared_->checkNext())) {
		uint32 x = 0;
		uint32 dl= s.decisionLevel() + 1;
		if (!STRATEGY(imp(sum(), min, opt(), actLev_)) || (dl = computeImplicationSet(s, min, x)) > s.rootLevel()) {
			for (--dl; !s.hasConflict() || s.resolveConflict(); ) {
				if      (s.undoUntil(dl, Solver::undo_pop_bt_level) > dl){ s.backtrack(); }
				else if (propagateImpl(s, propagate_new_opt))            { return true;   }
			}
		}
		if (!shared_->checkNext()) {
			break;
		}
		if (!step_.type) { ++step_.lev; }
		else             { stepLow() = ++opt()[step_.lev]; }
	}
	relaxBound(false);
	if (!s.hasConflict()) {
		s.undoUntil(0);
		s.setStopConflict();
	}
	return false;
}